

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::to_string<char[6],std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,char (*lhs) [6],string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  char **txt;
  basic_string_view<char,_std::char_traits<char>_> *value;
  string local_1f8;
  lest *local_1c8;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  string *op_local;
  char (*lhs_local) [6];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1c8 = this;
  to_string_abi_cxx11_(&local_1c0,(lest *)&local_1c8,txt);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<std::basic_string_view<char,std::char_traits<char>>>(&local_1f8,(lest *)op,value);
  std::operator<<(poVar1,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}